

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O0

bool double_conversion::(anonymous_namespace)::ConsumeSubStringImpl<char_const*,char(*)(char)>
               (char **current,char *end,char *substring,_func_char_char *converter)

{
  char cVar1;
  code *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  char *local_20;
  
  local_20 = (char *)(in_RDX + 1);
  while( true ) {
    if (*local_20 == '\0') {
      *in_RDI = *in_RDI + 1;
      return true;
    }
    *in_RDI = *in_RDI + 1;
    if ((*in_RDI == in_RSI) || (cVar1 = (*in_RCX)((int)*(char *)*in_RDI), cVar1 != *local_20))
    break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

static inline bool ConsumeSubStringImpl(Iterator* current,
                                        Iterator end,
                                        const char* substring,
                                        Converter converter) {
  DOUBLE_CONVERSION_ASSERT(converter(**current) == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || converter(**current) != *substring) {
      return false;
    }
  }
  ++*current;
  return true;
}